

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::dht_direct_response_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,dht_direct_response_alert *this)

{
  undefined8 uVar1;
  stack_allocator *this_00;
  char *pcVar2;
  unsigned_long uVar3;
  char *local_5f8;
  allocator<char> local_5b0;
  byte local_5af;
  byte local_5ae;
  allocator local_5ad [17];
  int local_59c;
  string local_598 [32];
  address local_578;
  string local_558;
  char local_538 [8];
  char msg [1299];
  dht_direct_response_alert *this_local;
  
  boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::address
            (&local_578,&(this->endpoint).super_basic_endpoint<boost::asio::ip::udp>);
  boost::asio::ip::address::to_string_abi_cxx11_(&local_558,&local_578);
  uVar1 = std::__cxx11::string::c_str();
  local_5ae = 0;
  local_5af = 0;
  if (this->m_response_size == 0) {
    local_5f8 = "";
  }
  else {
    this_00 = std::reference_wrapper<libtorrent::aux::stack_allocator>::get(&this->m_alloc);
    local_59c = (this->m_response_idx).m_idx;
    pcVar2 = libtorrent::aux::stack_allocator::ptr(this_00,(allocation_slot)local_59c);
    uVar3 = libtorrent::aux::numeric_cast<unsigned_long,int,void>(this->m_response_size);
    std::allocator<char>::allocator();
    local_5ae = 1;
    std::__cxx11::string::string(local_598,pcVar2,uVar3,local_5ad);
    local_5af = 1;
    local_5f8 = (char *)std::__cxx11::string::c_str();
  }
  snprintf(local_538,0x513,"DHT direct response (address=%s) [ %s ]",uVar1,local_5f8);
  if ((local_5af & 1) != 0) {
    std::__cxx11::string::~string(local_598);
  }
  if ((local_5ae & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)local_5ad);
  }
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_538,&local_5b0);
  std::allocator<char>::~allocator(&local_5b0);
  return __return_storage_ptr__;
}

Assistant:

std::string dht_direct_response_alert::message() const
	{
		char msg[MAX_DHT_MUTABLE_DATA_LENGTH + 50];
		std::snprintf(msg, sizeof(msg), "DHT direct response (address=%s) [ %s ]"
			, endpoint.address().to_string().c_str()
			, m_response_size ? std::string(m_alloc.get().ptr(m_response_idx)
				, aux::numeric_cast<std::size_t>(m_response_size)).c_str() : "");
		return msg;
	}